

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O1

void __thiscall layer::Convolution2D::backPropagate(Convolution2D *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  longdouble *plVar10;
  tensor ppplVar11;
  tensor *pppplVar12;
  undefined1 auVar13 [16];
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  Convolution2D *pCVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 Var24;
  undefined6 in_stack_ffffffffffffff82;
  ulong local_70;
  
  uVar1 = (this->super_Layer)._sizeZWeight;
  iVar2 = this->_sizeYIn;
  uVar14 = uVar1 * iVar2 * iVar2;
  if (0 < (int)uVar14) {
    plVar10 = **(this->super_Layer)._deltaIn;
    lVar17 = 0;
    do {
      *(longdouble *)((long)plVar10 + lVar17) = (longdouble)0;
      lVar17 = lVar17 + 0x10;
      in_ST6 = in_ST5;
    } while ((ulong)uVar14 << 4 != lVar17);
  }
  lVar17 = (long)(this->super_Layer)._sizeZOut;
  pCVar18 = this;
  if (0 < lVar17) {
    uVar14 = (this->super_Layer)._sizeXOut;
    uVar3 = (this->super_Layer)._sizeYOut;
    lVar19 = 0;
    do {
      if (0 < (int)uVar3) {
        local_70 = 0;
        do {
          if (0 < (int)uVar14) {
            iVar4 = this->_stepY;
            iVar5 = this->_zeroPaddingY;
            uVar6 = (this->super_Layer)._sizeYWeight;
            uVar22 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar23 = 0;
                do {
                  if (0 < (int)uVar6) {
                    iVar7 = this->_stepX;
                    iVar8 = this->_zeroPaddingX;
                    uVar9 = (this->super_Layer)._sizeXWeight;
                    uVar15 = 0;
                    uVar20 = iVar4 * (int)local_70 - iVar5;
                    do {
                      pCVar18 = (Convolution2D *)
                                CONCAT71((int7)((ulong)pCVar18 >> 8),iVar2 <= (int)uVar20);
                      if ((-1 < (int)uVar20 && 0 < (int)uVar9) && iVar2 > (int)uVar20) {
                        ppplVar11 = (this->super_Layer)._deltaIn;
                        pCVar18 = (Convolution2D *)(this->super_Layer)._delta;
                        pppplVar12 = (this->super_Layer)._ptrWeight;
                        lVar16 = 0;
                        uVar21 = iVar7 * (int)uVar22 - iVar8;
                        do {
                          if ((int)uVar21 < iVar2 && -1 < (int)uVar21) {
                            plVar10 = ppplVar11[uVar23][uVar20];
                            plVar10[uVar21] =
                                 plVar10[uVar21] +
                                 *(longdouble *)((long)pppplVar12[lVar19][uVar23][uVar15] + lVar16)
                                 * *(longdouble *)
                                    ((&(pCVar18->super_Layer)._vptr_Layer)[lVar19][local_70] +
                                    uVar22 * 0x10);
                            in_ST6 = in_ST5;
                          }
                          uVar21 = uVar21 + 1;
                          lVar16 = lVar16 + 0x10;
                        } while ((ulong)uVar9 << 4 != lVar16);
                      }
                      uVar20 = uVar20 + 1;
                      uVar15 = uVar15 + 1;
                    } while (uVar15 != uVar6);
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar1);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar14);
          }
          local_70 = local_70 + 1;
        } while (local_70 != uVar3);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar17);
  }
  if (0 < (this->super_Layer)._sizeZWeight * this->_sizeYIn * this->_sizeYIn) {
    lVar17 = 0;
    lVar19 = 0;
    do {
      auVar13._10_6_ = in_stack_ffffffffffffff82;
      auVar13._0_10_ = *(unkbyte10 *)((long)**(this->super_Layer)._deltaIn + lVar17);
      Var24 = in_ST6;
      (*(this->super_Layer)._fDerivative)((scalar *)pCVar18,(scalar)auVar13);
      *(unkbyte10 *)((long)**(this->super_Layer)._deltaIn + lVar17) = in_ST0;
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x10;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = Var24;
    } while (lVar19 < (this->super_Layer)._sizeZWeight * this->_sizeYIn * this->_sizeYIn);
  }
  return;
}

Assistant:

void Convolution2D::backPropagate()
    {
        int posXIn = 0;
        int posYIn = 0;

        for(int i(0); i < _sizeZWeight * _sizeYIn * _sizeYIn; i++)
            (**_deltaIn)[i] = 0;

        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _deltaIn[posZKernel][posYIn][posXIn] +=
                                                _delta[posZOut][posYOut][posXOut] *
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                }
            }
        }


        for(int i(0); i < _sizeZWeight * _sizeYIn * _sizeYIn; i++)
            (**_deltaIn)[i] = _fDerivative((**_deltaIn)[i]);
    }